

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

TextureMapping2DHandle __thiscall
pbrt::TextureMapping2DHandle::Create
          (TextureMapping2DHandle *this,ParameterDictionary *parameters,Transform *renderFromTexture
          ,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  uintptr_t iptr;
  undefined4 extraout_var;
  ulong uVar3;
  undefined8 *puVar4;
  undefined4 extraout_var_01;
  PlanarMapping2D *pPVar5;
  UVMapping2D *pUVar6;
  Float FVar7;
  Float FVar8;
  Float FVar9;
  Float FVar10;
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Vector3f VVar14;
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  Allocator alloc_local;
  Float local_16c;
  string local_168;
  string local_148;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  string type;
  Float local_84;
  string local_80;
  string local_60;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined4 extraout_var_00;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"mapping",(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"uv",(allocator<char> *)&local_80);
  ParameterDictionary::GetOneString(&type,parameters,&local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = std::operator==(&type,"uv");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"uscale",(allocator<char> *)&local_168);
    FVar7 = ParameterDictionary::GetOneFloat(parameters,&local_148,1.0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"vscale",(allocator<char> *)&local_168);
    FVar8 = ParameterDictionary::GetOneFloat(parameters,&local_148,1.0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"udelta",(allocator<char> *)&local_168);
    FVar9 = ParameterDictionary::GetOneFloat(parameters,&local_148,0.0);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"vdelta",(allocator<char> *)&local_168);
    FVar10 = ParameterDictionary::GetOneFloat(parameters,&local_148,0.0);
    std::__cxx11::string::~string((string *)&local_148);
    iVar2 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                      (alloc_local.memoryResource,0x10,4);
    pUVar6 = (UVMapping2D *)CONCAT44(extraout_var,iVar2);
    pUVar6->su = FVar7;
    pUVar6->sv = FVar8;
    pUVar6->du = FVar9;
    pUVar6->dv = FVar10;
LAB_002a4ee7:
    uVar3 = (ulong)pUVar6 | 0x1000000000000;
  }
  else {
    bVar1 = std::operator==(&type,"spherical");
    if (!bVar1) {
      bVar1 = std::operator==(&type,"cylindrical");
      if (bVar1) {
        local_148._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
        local_148._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
        local_148.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
        local_148.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
        uStack_128 = *(undefined8 *)(renderFromTexture->mInv).m[2];
        uStack_120 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
        uStack_118 = *(undefined8 *)(renderFromTexture->mInv).m[3];
        uStack_110 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
        local_108 = *(undefined8 *)(renderFromTexture->m).m[0];
        uStack_100 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
        uStack_f8 = *(undefined8 *)(renderFromTexture->m).m[1];
        uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
        uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[2];
        uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
        uStack_d8 = *(undefined8 *)(renderFromTexture->m).m[3];
        uStack_d0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
        iVar2 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                          (alloc_local.memoryResource,0x80,4);
        puVar4 = (undefined8 *)CONCAT44(extraout_var_01,iVar2);
        puVar4[8] = local_108;
        puVar4[9] = uStack_100;
        puVar4[10] = uStack_f8;
        puVar4[0xb] = uStack_f0;
        puVar4[0xc] = uStack_e8;
        puVar4[0xd] = uStack_e0;
        puVar4[0xe] = uStack_d8;
        puVar4[0xf] = uStack_d0;
        *puVar4 = local_148._M_dataplus._M_p;
        puVar4[1] = local_148._M_string_length;
        puVar4[2] = local_148.field_2._M_allocated_capacity;
        puVar4[3] = local_148.field_2._8_8_;
        puVar4[4] = uStack_128;
        puVar4[5] = uStack_120;
        puVar4[6] = uStack_118;
        puVar4[7] = uStack_110;
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)puVar4 | 0x3000000000000;
        goto LAB_002a4f70;
      }
      bVar1 = std::operator==(&type,"planar");
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"v1",&local_189);
        auVar13 = (undefined1  [56])0x0;
        local_30._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
        local_30.z = 0.0;
        VVar14 = ParameterDictionary::GetOneVector3f(parameters,&local_148,(Vector3f *)&local_30);
        local_b8.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar13;
        local_b8._0_8_ = vmovlps_avx(auVar11._0_16_);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"v2",&local_18a);
        auVar13 = ZEXT856(0);
        local_40.x = 0.0;
        local_40.y = 1.0;
        local_40.z = 0.0;
        VVar14 = ParameterDictionary::GetOneVector3f(parameters,&local_168,(Vector3f *)&local_40);
        local_c8.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar12._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar12._8_56_ = auVar13;
        local_c8._0_8_ = vmovlps_avx(auVar12._0_16_);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"udelta",&local_18b);
        local_16c = ParameterDictionary::GetOneFloat(parameters,&local_60,0.0);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vdelta",&local_18c);
        local_84 = ParameterDictionary::GetOneFloat(parameters,&local_80,0.0);
        pPVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
                 new_object<pbrt::PlanarMapping2D,pbrt::Vector3<float>,pbrt::Vector3<float>,float,float>
                           (&alloc_local,(Vector3<float> *)&local_b8,(Vector3<float> *)&local_c8,
                            &local_16c,&local_84);
        (this->
        super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
        ).bits = (ulong)pPVar5 | 0x4000000000000;
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_148);
        goto LAB_002a4f70;
      }
      Error<std::__cxx11::string&>(loc,"2D texture mapping \"%s\" unknown",&type);
      pUVar6 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::UVMapping2D>
                         (&alloc_local);
      goto LAB_002a4ee7;
    }
    local_148._M_dataplus._M_p = *(pointer *)(renderFromTexture->mInv).m[0];
    local_148._M_string_length = *(size_type *)((renderFromTexture->mInv).m[0] + 2);
    local_148.field_2._M_allocated_capacity = *(undefined8 *)(renderFromTexture->mInv).m[1];
    local_148.field_2._8_8_ = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
    uStack_128 = *(undefined8 *)(renderFromTexture->mInv).m[2];
    uStack_120 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
    uStack_118 = *(undefined8 *)(renderFromTexture->mInv).m[3];
    uStack_110 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
    local_108 = *(undefined8 *)(renderFromTexture->m).m[0];
    uStack_100 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
    uStack_f8 = *(undefined8 *)(renderFromTexture->m).m[1];
    uStack_f0 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
    uStack_e8 = *(undefined8 *)(renderFromTexture->m).m[2];
    uStack_e0 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
    uStack_d8 = *(undefined8 *)(renderFromTexture->m).m[3];
    uStack_d0 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
    iVar2 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                      (alloc_local.memoryResource,0x80,4);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
    puVar4[8] = local_108;
    puVar4[9] = uStack_100;
    puVar4[10] = uStack_f8;
    puVar4[0xb] = uStack_f0;
    puVar4[0xc] = uStack_e8;
    puVar4[0xd] = uStack_e0;
    puVar4[0xe] = uStack_d8;
    puVar4[0xf] = uStack_d0;
    *puVar4 = local_148._M_dataplus._M_p;
    puVar4[1] = local_148._M_string_length;
    puVar4[2] = local_148.field_2._M_allocated_capacity;
    puVar4[3] = local_148.field_2._8_8_;
    puVar4[4] = uStack_128;
    puVar4[5] = uStack_120;
    puVar4[6] = uStack_118;
    puVar4[7] = uStack_110;
    uVar3 = (ulong)puVar4 | 0x2000000000000;
  }
  (this->
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  ).bits = uVar3;
LAB_002a4f70:
  std::__cxx11::string::~string((string *)&type);
  return (TextureMapping2DHandle)
         (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          )this;
}

Assistant:

TextureMapping2DHandle TextureMapping2DHandle::Create(
    const ParameterDictionary &parameters, const Transform &renderFromTexture,
    const FileLoc *loc, Allocator alloc) {
    std::string type = parameters.GetOneString("mapping", "uv");
    if (type == "uv") {
        Float su = parameters.GetOneFloat("uscale", 1.);
        Float sv = parameters.GetOneFloat("vscale", 1.);
        Float du = parameters.GetOneFloat("udelta", 0.);
        Float dv = parameters.GetOneFloat("vdelta", 0.);
        return alloc.new_object<UVMapping2D>(su, sv, du, dv);
    } else if (type == "spherical")
        return alloc.new_object<SphericalMapping2D>(Inverse(renderFromTexture));
    else if (type == "cylindrical")
        return alloc.new_object<CylindricalMapping2D>(Inverse(renderFromTexture));
    else if (type == "planar")
        return alloc.new_object<PlanarMapping2D>(
            parameters.GetOneVector3f("v1", Vector3f(1, 0, 0)),
            parameters.GetOneVector3f("v2", Vector3f(0, 1, 0)),
            parameters.GetOneFloat("udelta", 0.f), parameters.GetOneFloat("vdelta", 0.f));
    else {
        Error(loc, "2D texture mapping \"%s\" unknown", type);
        return alloc.new_object<UVMapping2D>();
    }
}